

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::_free
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this)

{
  code *pcVar1;
  bool bVar2;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *psVar3;
  
  psVar3 = (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)this->m_stack;
  if (psVar3 == (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)0x0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: m_stack != nullptr",0x20,(anonymous_namespace)::s_default_callbacks);
    psVar3 = (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)this->m_stack;
  }
  if (psVar3 == this) {
    if (this->m_capacity != 0x10) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: m_capacity == N",0x1d,(anonymous_namespace)::s_default_callbacks);
    }
  }
  else {
    (*(this->m_callbacks).m_free)(psVar3,this->m_capacity * 0x30,(this->m_callbacks).m_user_data);
    this->m_stack = this->m_buf;
    this->m_size = 0x10;
    this->m_capacity = 0x10;
  }
  return;
}

Assistant:

void stack<T, N>::_free()
{
    RYML_ASSERT(m_stack != nullptr); // this structure cannot be memset() to zero
    if(m_stack != m_buf)
    {
        m_callbacks.m_free(m_stack, m_capacity * sizeof(T), m_callbacks.m_user_data);
        m_stack = m_buf;
        m_size = N;
        m_capacity = N;
    }
    else
    {
        RYML_ASSERT(m_capacity == N);
    }
}